

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  vector<int,_std::allocator<int>_> *has_bit_indices;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields;
  pointer *pppFVar1;
  pointer ppFVar2;
  FieldDescriptor *pFVar3;
  iterator __position;
  long lVar4;
  undefined1 auVar5 [8];
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint32 uVar10;
  int iVar11;
  FieldGeneratorMap *pFVar12;
  LogMessage *pLVar13;
  FieldGenerator *pFVar14;
  OneofDescriptor *pOVar15;
  bool bVar16;
  long lVar17;
  uint32 uVar18;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_01;
  OneofDescriptor *pOVar19;
  size_t sVar20;
  long *plVar21;
  Descriptor *descriptor;
  iterator __position_00;
  size_type *psVar22;
  byte bVar23;
  const_iterator __begin4;
  const_iterator __end4;
  pointer ppFVar24;
  bool bVar25;
  undefined4 uVar26;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar27;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  Hex HVar28;
  Hex HVar29;
  undefined1 local_1e0 [8];
  ColdChunkSkipper cold_skipper;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  Iterator __end4_1;
  Iterator __end3;
  undefined1 local_130 [8];
  Iterator __begin4_1;
  undefined1 local_108 [8];
  Formatter format;
  undefined1 auStack_c8 [8];
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  undefined1 local_a0 [16];
  Printer local_90 [40];
  undefined1 local_68 [8];
  string chunk_mask_str;
  int local_34 [2];
  int cached_has_word_index;
  
  local_108 = (undefined1  [8])printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&format,&(this->variables_)._M_t);
  Formatter::operator()<>
            ((Formatter *)local_108,
             "void $classname$::MergeFrom(const $classname$& from) {\n// @@protoc_insertion_point(class_specific_merge_from_start:$full_name$)\n  $DCHK$_NE(&from, this);\n"
            );
  google::protobuf::io::Printer::Indent();
  descriptor = this->descriptor_;
  if (0 < *(int *)(descriptor + 0x7c)) {
    Formatter::operator()<>((Formatter *)local_108,"_extensions_.MergeFrom(from._extensions_);\n");
    descriptor = this->descriptor_;
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
  vars._M_t._M_impl._0_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&this->options_;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  SetUnknkownFieldsVariable
            (descriptor,(Options *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&cold_skipper.limit_chunk_);
  Formatter::AddMap((Formatter *)local_108,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&cold_skipper.limit_chunk_);
  Formatter::operator()<>
            ((Formatter *)local_108,
             "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_metadata_);\n$uint32$ cached_has_bits = 0;\n(void) cached_has_bits;\n\n"
            );
  ppFVar24 = (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar26 = 0;
  uVar27 = 0;
  auStack_c8 = (undefined1  [8])0x0;
  chunks.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  chunks.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  chunk_mask_str.field_2._8_8_ = this;
  __position_00._M_current =
       chunks.
       super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  for (; chunks.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start = __position_00._M_current, ppFVar24 != ppFVar2;
      ppFVar24 = ppFVar24 + 1) {
    pFVar3 = *ppFVar24;
    local_1e0 = (undefined1  [8])pFVar3;
    if (auStack_c8 == (undefined1  [8])__position_00._M_current) {
LAB_001e3c34:
      if (__position_00._M_current ==
          chunks.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ::_M_realloc_insert<>
                  ((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                    *)auStack_c8,__position_00);
        __position_00._M_current =
             chunks.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        uVar26 = extraout_XMM0_Da_00;
        uVar27 = extraout_XMM0_Db_00;
      }
      else {
        uVar26 = 0;
        uVar27 = 0;
        ((__position_00._M_current)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position_00._M_current)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__position_00._M_current)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        chunks.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             chunks.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
        __position_00._M_current =
             chunks.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    else {
      iVar8 = HasByteIndex(this,__position_00._M_current[-1].
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1]);
      iVar9 = HasByteIndex((MessageGenerator *)chunk_mask_str.field_2._8_8_,pFVar3);
      this = (MessageGenerator *)chunk_mask_str.field_2._8_8_;
      uVar26 = extraout_XMM0_Da;
      uVar27 = extraout_XMM0_Db;
      if (iVar8 != iVar9) goto LAB_001e3c34;
    }
    __position._M_current =
         __position_00._M_current[-1].
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        __position_00._M_current[-1].
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)(__position_00._M_current + -1),__position,(FieldDescriptor **)local_1e0);
      uVar26 = extraout_XMM0_Da_01;
      uVar27 = extraout_XMM0_Db_01;
    }
    else {
      *__position._M_current = (FieldDescriptor *)local_1e0;
      pppFVar1 = &__position_00._M_current[-1].
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
    __position_00._M_current =
         chunks.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  has_bit_indices = &this->has_bit_indices_;
  anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
            ((ColdChunkSkipper *)local_1e0,
             (Options *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              *)auStack_c8,has_bit_indices,(double)CONCAT44(uVar27,uVar26));
  local_34[0] = -1;
  if ((undefined1  [8])
      chunks.
      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != auStack_c8) {
    pFVar12 = (FieldGeneratorMap *)(chunk_mask_str.field_2._8_8_ + 0xd0);
    pOVar19 = (OneofDescriptor *)0x0;
    do {
      auVar5 = auStack_c8;
      psVar22 = &chunk_mask_str._M_string_length;
      ppFVar24 = (((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)((long)auStack_c8 + pOVar19 * 0x18))->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      __begin4_1.descriptor = pOVar19;
      if ((ulong)((long)(((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)((long)auStack_c8 + pOVar19 * 0x18))->
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar24) < 9) {
        bVar25 = false;
      }
      else {
        iVar8 = HasByteIndex((MessageGenerator *)chunk_mask_str.field_2._8_8_,*ppFVar24);
        bVar25 = iVar8 != -1;
      }
      local_68 = (undefined1  [8])psVar22;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"from.","");
      local_a0._0_8_ = printer;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_a0 + 8),
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&cold_skipper.cold_threshold_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_a0 + 8));
      if (local_68 != (undefined1  [8])psVar22) {
        operator_delete((void *)local_68);
      }
      fields = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)((long)auVar5 + pOVar19 * 0x18);
      if (bVar25) {
        uVar10 = anon_unknown_0::GenChunkMask(fields,has_bit_indices);
        HVar28.value = (ulong)uVar10;
        HVar28._8_8_ = 8;
        google::protobuf::strings::AlphaNum::AlphaNum((AlphaNum *)local_a0,HVar28);
        local_68 = (undefined1  [8])psVar22;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,local_a0._0_8_,(Printer *)(local_a0._0_8_ + local_a0._8_8_));
        if (uVar10 == 0) {
LAB_001e3e13:
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xca1);
          pLVar13 = (LogMessage *)
                    google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_a0,"CHECK failed: (2) <= (popcnt(chunk_mask)): ")
          ;
          google::protobuf::internal::LogFinisher::operator=
                    ((LogFinisher *)&__end4_1.descriptor,pLVar13);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a0);
        }
        else {
          iVar8 = 0;
          uVar18 = uVar10;
          do {
            iVar8 = iVar8 + (uVar18 & 1);
            bVar16 = 1 < uVar18;
            uVar18 = uVar18 >> 1;
          } while (bVar16);
          if (iVar8 < 2) goto LAB_001e3e13;
        }
        if (uVar10 != 0) {
          iVar8 = 0;
          do {
            iVar8 = iVar8 + (uVar10 & 1);
            bVar16 = 1 < uVar10;
            uVar10 = uVar10 >> 1;
          } while (bVar16);
          if (8 < iVar8) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xca2);
            pLVar13 = (LogMessage *)
                      google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_a0,
                                 "CHECK failed: (8) >= (popcnt(chunk_mask)): ");
            google::protobuf::internal::LogFinisher::operator=
                      ((LogFinisher *)&__end4_1.descriptor,pLVar13);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a0);
          }
        }
        iVar8 = local_34[0];
        iVar9 = HasWordIndex((MessageGenerator *)chunk_mask_str.field_2._8_8_,
                             *(fields->
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              )._M_impl.super__Vector_impl_data._M_start);
        if (iVar8 != iVar9) {
          local_34[0] = iVar9;
          Formatter::operator()
                    ((Formatter *)local_108,"cached_has_bits = from._has_bits_[$1$];\n",local_34);
        }
        Formatter::operator()
                  ((Formatter *)local_108,"if (cached_has_bits & 0x$1$u) {\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
        google::protobuf::io::Printer::Indent();
        if (local_68 != (undefined1  [8])psVar22) {
          operator_delete((void *)local_68);
        }
        ppFVar24 = (fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)(fields->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
        if (ppFVar24 == (pointer)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          if (!bVar25) goto LAB_001e43dc;
        }
        else {
LAB_001e3f6c:
          bVar16 = false;
          do {
            pFVar3 = *ppFVar24;
            pFVar14 = FieldGeneratorMap::get(pFVar12,pFVar3);
            iVar9 = local_34[0];
            iVar8 = *(int *)(pFVar3 + 0x3c);
            if (iVar8 == 3) {
              (*pFVar14->_vptr_FieldGenerator[0xc])(pFVar14,printer);
            }
            else {
              if (iVar8 == 1) {
                if (((pFVar3[0x41] == (FieldDescriptor)0x0) &&
                    ((*(int *)(*(long *)(pFVar3 + 0x28) + 0x3c) != 2 ||
                     (*(long *)(pFVar3 + 0x58) != 0)))) ||
                   (bVar23 = *(byte *)(*(long *)(pFVar3 + 0x78) + 0x4f), bVar23 == 1)) {
                  local_a0._0_8_ = local_90;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"from.","");
                  bVar7 = anon_unknown_0::EmitFieldNonDefaultCondition
                                    (printer,(string *)local_a0,pFVar3);
                  if ((Printer *)local_a0._0_8_ != local_90) {
                    operator_delete((void *)local_a0._0_8_);
                  }
                  (*pFVar14->_vptr_FieldGenerator[0xc])(pFVar14,printer);
                  if (bVar7) {
                    google::protobuf::io::Printer::Outdent();
                    Formatter::operator()<>((Formatter *)local_108,"}\n");
                  }
                  goto LAB_001e419d;
                }
              }
              else {
                bVar23 = *(byte *)(*(long *)(pFVar3 + 0x78) + 0x4f);
              }
              if ((bVar23 & 1) == 0) {
                iVar11 = HasWordIndex((MessageGenerator *)chunk_mask_str.field_2._8_8_,pFVar3);
                if (iVar9 == iVar11) {
                  if (pFVar3[0x41] == (FieldDescriptor)0x0) {
                    if ((iVar8 == 1) && (*(int *)(*(long *)(pFVar3 + 0x28) + 0x3c) == 2)) {
                      if (*(long *)(pFVar3 + 0x58) != 0) {
LAB_001e41d9:
                        google::protobuf::internal::LogMessage::LogMessage
                                  ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                                   ,0xcca);
                        pLVar13 = (LogMessage *)
                                  google::protobuf::internal::LogMessage::operator<<
                                            ((LogMessage *)local_a0,
                                             "CHECK failed: HasHasbit(field): ");
                        google::protobuf::internal::LogFinisher::operator=
                                  ((LogFinisher *)local_68,pLVar13);
                        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a0);
                      }
                    }
                    else if (iVar8 != 2) goto LAB_001e41d9;
                  }
                  if (pFVar3[0x43] == (FieldDescriptor)0x0) {
                    plVar21 = (long *)(*(long *)(pFVar3 + 0x50) + 0x28);
                  }
                  else if (*(long *)(pFVar3 + 0x60) == 0) {
                    plVar21 = (long *)(*(long *)(pFVar3 + 0x28) + 0x80);
                  }
                  else {
                    plVar21 = (long *)(*(long *)(pFVar3 + 0x60) + 0x50);
                  }
                  HVar29.value = 1L << (*(byte *)((has_bit_indices->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_start +
                                                 (int)((ulong)((long)pFVar3 - *plVar21) >> 3) *
                                                 0x286bca1b) & 0x1f);
                  HVar29._8_8_ = 8;
                  google::protobuf::strings::AlphaNum::AlphaNum((AlphaNum *)local_a0,HVar29);
                  local_68 = (undefined1  [8])&chunk_mask_str._M_string_length;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_68,local_a0._0_8_,
                             (Printer *)(local_a0._0_8_ + local_a0._8_8_));
                  Formatter::operator()
                            ((Formatter *)local_108,"if (cached_has_bits & 0x$1$u) {\n",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68);
                  google::protobuf::io::Printer::Indent();
                  if ((bVar25) && (bVar7 = anon_unknown_0::IsPOD(pFVar3), bVar7)) {
                    bVar16 = true;
                    (*pFVar14->_vptr_FieldGenerator[0xd])(pFVar14,printer);
                  }
                  else {
                    (*pFVar14->_vptr_FieldGenerator[0xc])(pFVar14,printer);
                  }
                  google::protobuf::io::Printer::Outdent();
                  Formatter::operator()<>((Formatter *)local_108,"}\n");
                  if (local_68 != (undefined1  [8])&chunk_mask_str._M_string_length) {
                    operator_delete((void *)local_68);
                  }
                  goto LAB_001e419d;
                }
                field = extraout_RDX_00;
                if (pFVar3[0x41] == (FieldDescriptor)0x0) goto LAB_001e40ba;
              }
              else {
                field = extraout_RDX;
                if (pFVar3[0x41] == (FieldDescriptor)0x0) {
LAB_001e40ba:
                  if ((iVar8 == 1) && (*(int *)(*(long *)(pFVar3 + 0x28) + 0x3c) == 2)) {
                    if (*(long *)(pFVar3 + 0x58) == 0) {
LAB_001e40d9:
                      if ((bVar23 & 1) == 0) goto LAB_001e412b;
                    }
                  }
                  else if (iVar8 == 2) goto LAB_001e40d9;
                }
                google::protobuf::internal::LogMessage::LogMessage
                          ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                           ,0xcc2);
                pLVar13 = (LogMessage *)
                          google::protobuf::internal::LogMessage::operator<<
                                    ((LogMessage *)local_a0,"CHECK failed: HasHasbit(field): ");
                google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_68,pLVar13);
                google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a0);
                field = extraout_RDX_01;
              }
LAB_001e412b:
              FieldName_abi_cxx11_((string *)local_a0,(cpp *)pFVar3,field);
              Formatter::operator()
                        ((Formatter *)local_108,"if (from._internal_has_$1$()) {\n",
                         (string *)local_a0);
              if ((Printer *)local_a0._0_8_ != local_90) {
                operator_delete((void *)local_a0._0_8_);
              }
              google::protobuf::io::Printer::Indent();
              (*pFVar14->_vptr_FieldGenerator[0xc])(pFVar14,printer);
              google::protobuf::io::Printer::Outdent();
              Formatter::operator()<>((Formatter *)local_108,"}\n");
            }
LAB_001e419d:
            ppFVar24 = ppFVar24 + 1;
          } while (ppFVar24 !=
                   (pointer)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if (!bVar25) goto LAB_001e43dc;
          if (bVar16) {
            if (local_34[0] < 0) {
              google::protobuf::internal::LogMessage::LogMessage
                        ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0xce2);
              pLVar13 = (LogMessage *)
                        google::protobuf::internal::LogMessage::operator<<
                                  ((LogMessage *)local_a0,
                                   "CHECK failed: (0) <= (cached_has_word_index): ");
              google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_68,pLVar13);
              google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a0);
            }
            Formatter::operator()
                      ((Formatter *)local_108,"_has_bits_[$1$] |= cached_has_bits;\n",local_34);
          }
        }
        google::protobuf::io::Printer::Outdent();
        Formatter::operator()<>((Formatter *)local_108,"}\n");
      }
      else {
        ppFVar24 = (fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)(fields->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
        if (ppFVar24 != (pointer)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count)
        goto LAB_001e3f6c;
      }
LAB_001e43dc:
      bVar25 = anon_unknown_0::ColdChunkSkipper::OnEndChunk
                         ((ColdChunkSkipper *)local_1e0,(int)__begin4_1.descriptor,printer);
      if (bVar25) {
        local_34[0] = -1;
      }
      pOVar19 = __begin4_1.descriptor + 1;
      pOVar15 = (OneofDescriptor *)
                (((long)chunks.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)auStack_c8 >> 3) *
                -0x5555555555555555);
    } while (pOVar19 <= pOVar15 && (long)pOVar15 - (long)pOVar19 != 0);
  }
  chunk_mask_str._M_dataplus._M_p = *(pointer *)chunk_mask_str.field_2._8_8_;
  local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffff00000000);
  __end4_1.descriptor._0_4_ = *(undefined4 *)(chunk_mask_str._M_dataplus._M_p + 0x70);
  pFVar12 = (FieldGeneratorMap *)(chunk_mask_str.field_2._8_8_ + 0xd0);
  while (uVar6 = chunk_mask_str.field_2._8_8_,
        bVar25 = operator==((Iterator *)local_68,(Iterator *)&__end4_1.descriptor), !bVar25) {
    lVar17 = (long)(int)local_68._0_4_;
    lVar4 = *(long *)(chunk_mask_str._M_dataplus._M_p + 0x30);
    Formatter::operator()
              ((Formatter *)local_108,"switch (from.$1$_case()) {\n",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (lVar4 + lVar17 * 0x30));
    google::protobuf::io::Printer::Indent();
    plVar21 = (long *)(lVar4 + lVar17 * 0x30);
    local_130._0_4_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = (undefined4)plVar21[3];
    __end4_1._0_8_ = plVar21;
    __begin4_1._0_8_ = plVar21;
    while (bVar25 = operator==((Iterator *)local_130,
                               (Iterator *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count),
          !bVar25) {
      pFVar3 = *(FieldDescriptor **)
                (*(long *)(__begin4_1._0_8_ + 0x20) + (long)(int)local_130._0_4_ * 8);
      UnderscoresToCamelCase((string *)local_a0,*(string **)pFVar3,true);
      Formatter::operator()((Formatter *)local_108,"case k$1$: {\n",(string *)local_a0);
      if ((Printer *)local_a0._0_8_ != local_90) {
        operator_delete((void *)local_a0._0_8_);
      }
      google::protobuf::io::Printer::Indent();
      pFVar14 = FieldGeneratorMap::get(pFVar12,pFVar3);
      (*pFVar14->_vptr_FieldGenerator[0xc])(pFVar14,printer);
      Formatter::operator()<>((Formatter *)local_108,"break;\n");
      google::protobuf::io::Printer::Outdent();
      Formatter::operator()<>((Formatter *)local_108,"}\n");
      local_130._0_4_ = local_130._0_4_ + 1;
    }
    local_a0._0_8_ = local_90;
    lVar4 = *(long *)*plVar21;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,lVar4,((long *)*plVar21)[1] + lVar4);
    if (local_a0._8_8_ != 0) {
      sVar20 = 0;
      do {
        if ((byte)((char)*(Printer *)(local_a0._0_8_ + sVar20) + 0x9fU) < 0x1a) {
          *(char *)(local_a0._0_8_ + sVar20) = (char)*(Printer *)(local_a0._0_8_ + sVar20) + -0x20;
        }
        sVar20 = sVar20 + 1;
      } while (local_a0._8_8_ != sVar20);
    }
    Formatter::operator()
              ((Formatter *)local_108,"case $1$_NOT_SET: {\n  break;\n}\n",(string *)local_a0);
    if ((Printer *)local_a0._0_8_ != local_90) {
      operator_delete((void *)local_a0._0_8_);
    }
    google::protobuf::io::Printer::Outdent();
    Formatter::operator()<>((Formatter *)local_108,"}\n");
    local_68._0_4_ = local_68._0_4_ + 1;
  }
  if (*(int *)(uVar6 + 0x15c) != 0) {
    Formatter::operator()<>
              ((Formatter *)local_108,"_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
  }
  google::protobuf::io::Printer::Outdent();
  Formatter::operator()<>((Formatter *)local_108,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&cold_skipper.cold_threshold_);
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::~vector((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             *)auStack_c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&cold_skipper.limit_chunk_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&format);
  return;
}

Assistant:

void MessageGenerator::GenerateClassSpecificMergeFrom(io::Printer* printer) {
  // Generate the class-specific MergeFrom, which avoids the GOOGLE_CHECK and cast.
  Formatter format(printer, variables_);
  format(
      "void $classname$::MergeFrom(const $classname$& from) {\n"
      "// @@protoc_insertion_point(class_specific_merge_from_start:"
      "$full_name$)\n"
      "  $DCHK$_NE(&from, this);\n");
  format.Indent();

  if (descriptor_->extension_range_count() > 0) {
    format("_extensions_.MergeFrom(from._extensions_);\n");
  }
  std::map<std::string, std::string> vars;
  SetUnknkownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);
  format(
      "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_"
      "metadata_);\n"
      "$uint32$ cached_has_bits = 0;\n"
      "(void) cached_has_bits;\n\n");

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return HasByteIndex(a) == HasByteIndex(b);
      });

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);

  // cached_has_word_index maintains that:
  //   cached_has_bits = from._has_bits_[cached_has_word_index]
  // for cached_has_word_index >= 0
  int cached_has_word_index = -1;

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    const std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    bool have_outer_if =
        chunk.size() > 1 && HasByteIndex(chunk.front()) != kNoHasbit;
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "from.",
                              printer);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32 chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = from._has_bits_[$1$];\n",
               cached_has_word_index);
      }

      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    // Go back and emit merging code for each of the fields we processed.
    bool deferred_has_bit_changes = false;
    for (const auto field : chunk) {
      const FieldGenerator& generator = field_generators_.get(field);

      if (field->is_repeated()) {
        generator.GenerateMergingCode(printer);
      } else if (field->is_optional() && !HasHasbit(field)) {
        // Merge semantics without true field presence: primitive fields are
        // merged only if non-zero (numeric) or non-empty (string).
        bool have_enclosing_if =
            EmitFieldNonDefaultCondition(printer, "from.", field);
        generator.GenerateMergingCode(printer);
        if (have_enclosing_if) {
          format.Outdent();
          format("}\n");
        }
      } else if (field->options().weak() ||
                 cached_has_word_index != HasWordIndex(field)) {
        // Check hasbit, not using cached bits.
        GOOGLE_CHECK(HasHasbit(field));
        format("if (from._internal_has_$1$()) {\n", FieldName(field));
        format.Indent();
        generator.GenerateMergingCode(printer);
        format.Outdent();
        format("}\n");
      } else {
        // Check hasbit, using cached bits.
        GOOGLE_CHECK(HasHasbit(field));
        int has_bit_index = has_bit_indices_[field->index()];
        const std::string mask = StrCat(
            strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
        format("if (cached_has_bits & 0x$1$u) {\n", mask);
        format.Indent();

        if (have_outer_if && IsPOD(field)) {
          // Defer hasbit modification until the end of chunk.
          // This can reduce the number of loads/stores by up to 7 per 8 fields.
          deferred_has_bit_changes = true;
          generator.GenerateCopyConstructorCode(printer);
        } else {
          generator.GenerateMergingCode(printer);
        }

        format.Outdent();
        format("}\n");
      }
    }

    if (have_outer_if) {
      if (deferred_has_bit_changes) {
        // Flush the has bits for the primitives we deferred.
        GOOGLE_CHECK_LE(0, cached_has_word_index);
        format("_has_bits_[$1$] |= cached_has_bits;\n", cached_has_word_index);
      }

      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Merge oneof fields. Oneof field requires oneof case check.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("switch (from.$1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (IsFieldUsed(field, options_)) {
        field_generators_.get(field).GenerateMergingCode(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }
  if (num_weak_fields_) {
    format("_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
  }

  format.Outdent();
  format("}\n");
}